

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall WebSocketsession::on_run(WebSocketsession *this)

{
  element_type *peVar1;
  vtable *pvVar2;
  timeout opt;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  undefined1 local_88 [16];
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  storage local_60;
  vtable *local_38;
  
  local_88._0_8_ = 30000000000;
  local_88._8_8_ = 300000000000;
  local_78 = (element_type *)0x1;
  boost::beast::websocket::
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
  ::impl_type::set_option((this->ws).impl_.px,(timeout *)local_88);
  local_38 = (vtable *)
             &boost::beast::websocket::detail::decorator::
              vtable_impl<WebSocketsession::on_run()::{lambda(boost::beast::http::message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&)#1},true>
              ::get()::impl;
  peVar1 = (this->ws).impl_.px;
  (*((peVar1->decorator_opt).vtable_)->destroy)(&(peVar1->decorator_opt).storage_);
  pvVar2 = local_38;
  local_38 = (vtable *)boost::beast::websocket::detail::decorator::vtable::get_default()::impl;
  (peVar1->decorator_opt).vtable_ = pvVar2;
  (*pvVar2->move)(&(peVar1->decorator_opt).storage_,&local_60);
  (**(code **)((long)local_38 + 8))(&local_60);
  std::__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<WebSocketsession,void>
            ((__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (__weak_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_88._0_8_ = on_accept;
  local_88._8_8_ = 0;
  local_78 = local_98;
  _Stack_70._M_pi = p_Stack_90;
  local_98 = (element_type *)0x0;
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::websocket::
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
  ::
  async_accept<boost::beast::detail::bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code),_std::shared_ptr<WebSocketsession>_>_>
            (&this->ws,
             (bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code),_std::shared_ptr<WebSocketsession>_>
              *)local_88);
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  return;
}

Assistant:

void on_run()
    {
        // Set suggested timeout settings for the websocket
        ws.set_option(websocket::stream_base::timeout::suggested(beast::role_type::server));

        // Set a decorator to change the Server of the handshake
        ws.set_option(websocket::stream_base::decorator([](websocket::response_type& res) {
            res.set(http::field::server, std::string("HELICS_WEB_SERVER" HELICS_VERSION_STRING));
        }));
        // Accept the websocket handshake
        ws.async_accept(
            beast::bind_front_handler(&WebSocketsession::on_accept, shared_from_this()));
    }